

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_tile_rows(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  av1_extracfg *in_RSI;
  undefined8 *in_RDI;
  uint tile_rows;
  av1_extracfg extra_cfg;
  int *local_288;
  undefined1 local_270 [36];
  int local_24c;
  av1_extracfg *local_18;
  aom_codec_err_t local_4;
  
  if (*(int *)(in_RDI + 0x90) == 0) {
    local_18 = in_RSI;
    memcpy(local_270,in_RDI + 0x8b,600);
    uVar1 = local_18->cpu_used;
    if (uVar1 < 0x29) {
      local_288 = (int *)((long)(int)uVar1 + *(long *)&local_18->sharpness);
      local_18->cpu_used = uVar1 + 8;
    }
    else {
      local_288 = *(int **)&local_18->enable_auto_bwd_ref;
      *(int **)&local_18->enable_auto_bwd_ref = local_288 + 2;
    }
    iVar2 = *local_288;
    if (iVar2 == local_24c) {
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_24c = iVar2;
      local_4 = update_extra_cfg((aom_codec_alg_priv_t_conflict *)CONCAT44(iVar2,uVar1),local_18);
    }
  }
  else {
    *in_RDI = "AUTO_TILES is set so AV1E_SET_TILE_ROWS should not be called.";
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_tile_rows(aom_codec_alg_priv_t *ctx,
                                          va_list args) {
  // If the control AUTO_TILES is used (set to 1) then don't override
  // the tile_rows set via the AUTO_TILES control.
  if (ctx->extra_cfg.auto_tiles) {
    ERROR("AUTO_TILES is set so AV1E_SET_TILE_ROWS should not be called.");
  }
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  unsigned int tile_rows = CAST(AV1E_SET_TILE_ROWS, args);
  if (tile_rows == extra_cfg.tile_rows) return AOM_CODEC_OK;
  extra_cfg.tile_rows = tile_rows;
  return update_extra_cfg(ctx, &extra_cfg);
}